

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>::basic_dynamic_counter
          (basic_dynamic_counter<double,_(unsigned_char)__x02_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  local_68;
  
  std::__cxx11::string::string(&local_88,name);
  std::__cxx11::string::string(&bStack_a8,help);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  array(&local_68,labels_name);
  dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_t<2ul>
            ((dynamic_metric_impl<std::atomic<double>,(unsigned_char)2> *)this,Counter,&local_88,
             &bStack_a8,&local_68);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array(&local_68);
  std::__cxx11::string::~string((string *)&bStack_a8);
  std::__cxx11::string::~string((string *)&local_88);
  (this->super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>).super_dynamic_metric
  .super_metric_t._vptr_metric_t = (_func_int **)&PTR__dynamic_metric_impl_001e99c0;
  return;
}

Assistant:

basic_dynamic_counter(std::string name, std::string help,
                        std::array<std::string, N> labels_name)
      : Base(MetricType::Counter, std::move(name), std::move(help),
             std::move(labels_name)) {}